

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlDetachObjectFromDictionaryObject(JlDataObject *DictionaryObject,char *KeyName)

{
  JlDataObject *pJVar1;
  JlDataObject *object;
  JL_STATUS jlStatus;
  char *KeyName_local;
  JlDataObject *DictionaryObject_local;
  
  if (((DictionaryObject == (JlDataObject *)0x0) || (KeyName == (char *)0x0)) || (*KeyName == '\0'))
  {
    object._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else if (DictionaryObject->Type == JL_DATA_TYPE_DICTIONARY) {
    pJVar1 = FindAndDetachDictionaryItem(&(DictionaryObject->field_2).Dictionary,KeyName);
    if (pJVar1 == (JlDataObject *)0x0) {
      object._4_4_ = JL_STATUS_NOT_FOUND;
    }
    else {
      object._4_4_ = JL_STATUS_SUCCESS;
    }
  }
  else {
    object._4_4_ = JL_STATUS_WRONG_TYPE;
  }
  return object._4_4_;
}

Assistant:

JL_STATUS
    JlDetachObjectFromDictionaryObject
    (
        JlDataObject*   DictionaryObject,
        char const*     KeyName
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  0 != KeyName[0] )
    {
        if( JL_DATA_TYPE_DICTIONARY == DictionaryObject->Type )
        {
            // Find and detach object
            JlDataObject* object = FindAndDetachDictionaryItem( &DictionaryObject->Dictionary, KeyName );
            if( NULL != object )
            {
                // object is now detached from the dictionary.
                jlStatus = JL_STATUS_SUCCESS;
            }
            else
            {
                jlStatus = JL_STATUS_NOT_FOUND;
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}